

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

void __thiscall slang::ast::builtins::Builtins::registerSystemTasks(Builtins *this)

{
  StringType *pSVar1;
  PredefinedIntegerType *__args_1;
  VoidType *__args_1_00;
  int iVar2;
  initializer_list<const_slang::ast::Type_*> __l;
  initializer_list<const_slang::ast::Type_*> __l_00;
  initializer_list<const_slang::ast::Type_*> __l_01;
  initializer_list<const_slang::ast::Type_*> __l_02;
  initializer_list<const_slang::ast::Type_*> __l_03;
  initializer_list<const_slang::ast::Type_*> __l_04;
  initializer_list<const_slang::ast::Type_*> __l_05;
  initializer_list<const_slang::ast::Type_*> __l_06;
  initializer_list<const_slang::ast::Type_*> __l_07;
  initializer_list<const_slang::ast::Type_*> __l_08;
  initializer_list<const_slang::ast::Type_*> __l_09;
  initializer_list<const_slang::ast::Type_*> __l_10;
  initializer_list<const_slang::ast::Type_*> __l_11;
  initializer_list<const_slang::ast::Type_*> __l_12;
  initializer_list<const_slang::ast::Type_*> __l_13;
  initializer_list<const_slang::ast::Type_*> __l_14;
  initializer_list<const_slang::ast::Type_*> __l_15;
  undefined1 local_6e1;
  KnownSystemName local_6e0;
  allocator_type local_6d9;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_6d8;
  PredefinedIntegerType *local_6c0;
  int local_6ac;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_6a8;
  PredefinedIntegerType *local_688;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_680;
  shared_ptr<slang::ast::SystemSubroutine> local_678;
  shared_ptr<slang::ast::SystemSubroutine> local_668;
  shared_ptr<slang::ast::SystemSubroutine> local_658;
  shared_ptr<slang::ast::SystemSubroutine> local_648;
  shared_ptr<slang::ast::SystemSubroutine> local_638;
  shared_ptr<slang::ast::SystemSubroutine> local_628;
  shared_ptr<slang::ast::SystemSubroutine> local_618;
  shared_ptr<slang::ast::SystemSubroutine> local_608;
  shared_ptr<slang::ast::SystemSubroutine> local_5f8;
  shared_ptr<slang::ast::SystemSubroutine> local_5e8;
  shared_ptr<slang::ast::SystemSubroutine> local_5d8;
  shared_ptr<slang::ast::SystemSubroutine> local_5c8;
  shared_ptr<slang::ast::SystemSubroutine> local_5b8;
  shared_ptr<slang::ast::SystemSubroutine> local_5a8;
  shared_ptr<slang::ast::SystemSubroutine> local_598;
  shared_ptr<slang::ast::SystemSubroutine> local_588;
  shared_ptr<slang::ast::SystemSubroutine> local_578;
  shared_ptr<slang::ast::SystemSubroutine> local_568;
  shared_ptr<slang::ast::SystemSubroutine> local_558;
  shared_ptr<slang::ast::SystemSubroutine> local_548;
  shared_ptr<slang::ast::SystemSubroutine> local_538;
  shared_ptr<slang::ast::SystemSubroutine> local_528;
  shared_ptr<slang::ast::SystemSubroutine> local_518;
  shared_ptr<slang::ast::SystemSubroutine> local_508;
  shared_ptr<slang::ast::SystemSubroutine> local_4f8;
  shared_ptr<slang::ast::SystemSubroutine> local_4e8;
  shared_ptr<slang::ast::SystemSubroutine> local_4d8;
  shared_ptr<slang::ast::SystemSubroutine> local_4c8;
  shared_ptr<slang::ast::SystemSubroutine> local_4b8;
  shared_ptr<slang::ast::SystemSubroutine> local_4a8;
  shared_ptr<slang::ast::SystemSubroutine> local_498;
  shared_ptr<slang::ast::SystemSubroutine> local_488;
  shared_ptr<slang::ast::SystemSubroutine> local_478;
  shared_ptr<slang::ast::SystemSubroutine> local_468;
  shared_ptr<slang::ast::SystemSubroutine> local_458;
  shared_ptr<slang::ast::SystemSubroutine> local_448;
  shared_ptr<slang::ast::SystemSubroutine> local_438;
  shared_ptr<slang::ast::SystemSubroutine> local_428;
  shared_ptr<slang::ast::SystemSubroutine> local_418;
  shared_ptr<slang::ast::SystemSubroutine> local_408;
  shared_ptr<slang::ast::SystemSubroutine> local_3f8;
  shared_ptr<slang::ast::SystemSubroutine> local_3e8;
  shared_ptr<slang::ast::SystemSubroutine> local_3d8;
  shared_ptr<slang::ast::SystemSubroutine> local_3c8;
  shared_ptr<slang::ast::SystemSubroutine> local_3b8;
  shared_ptr<slang::ast::SystemSubroutine> local_3a8;
  shared_ptr<slang::ast::SystemSubroutine> local_398;
  shared_ptr<slang::ast::SystemSubroutine> local_388;
  shared_ptr<slang::ast::SystemSubroutine> local_378;
  shared_ptr<slang::ast::SystemSubroutine> local_368;
  shared_ptr<slang::ast::SystemSubroutine> local_358;
  shared_ptr<slang::ast::SystemSubroutine> local_348;
  shared_ptr<slang::ast::SystemSubroutine> local_338;
  shared_ptr<slang::ast::SystemSubroutine> local_328;
  shared_ptr<slang::ast::SystemSubroutine> local_318;
  shared_ptr<slang::ast::SystemSubroutine> local_308;
  shared_ptr<slang::ast::SystemSubroutine> local_2f8;
  shared_ptr<slang::ast::SystemSubroutine> local_2e8;
  shared_ptr<slang::ast::SystemSubroutine> local_2d8;
  shared_ptr<slang::ast::SystemSubroutine> local_2c8;
  shared_ptr<slang::ast::SystemSubroutine> local_2b8;
  shared_ptr<slang::ast::SystemSubroutine> local_2a8;
  shared_ptr<slang::ast::SystemSubroutine> local_298;
  shared_ptr<slang::ast::SystemSubroutine> local_288;
  shared_ptr<slang::ast::SystemSubroutine> local_278;
  shared_ptr<slang::ast::SystemSubroutine> local_268;
  shared_ptr<slang::ast::SystemSubroutine> local_258;
  shared_ptr<slang::ast::SystemSubroutine> local_248;
  shared_ptr<slang::ast::SystemSubroutine> local_238;
  shared_ptr<slang::ast::SystemSubroutine> local_228;
  shared_ptr<slang::ast::SystemSubroutine> local_218;
  shared_ptr<slang::ast::SystemSubroutine> local_208;
  shared_ptr<slang::ast::SystemSubroutine> local_1f8;
  shared_ptr<slang::ast::SystemSubroutine> local_1e8;
  shared_ptr<slang::ast::SystemSubroutine> local_1d8;
  shared_ptr<slang::ast::SystemSubroutine> local_1c8;
  shared_ptr<slang::ast::SystemSubroutine> local_1b8;
  shared_ptr<slang::ast::SystemSubroutine> local_1a8;
  shared_ptr<slang::ast::SystemSubroutine> local_198;
  shared_ptr<slang::ast::SystemSubroutine> local_188;
  shared_ptr<slang::ast::SystemSubroutine> local_178;
  shared_ptr<slang::ast::SystemSubroutine> local_168;
  shared_ptr<slang::ast::SystemSubroutine> local_158;
  shared_ptr<slang::ast::SystemSubroutine> local_148;
  shared_ptr<slang::ast::SystemSubroutine> local_138;
  shared_ptr<slang::ast::SystemSubroutine> local_128;
  shared_ptr<slang::ast::SystemSubroutine> local_118;
  shared_ptr<slang::ast::SystemSubroutine> local_108;
  shared_ptr<slang::ast::SystemSubroutine> local_f8;
  shared_ptr<slang::ast::SystemSubroutine> local_e8;
  shared_ptr<slang::ast::SystemSubroutine> local_d8;
  shared_ptr<slang::ast::SystemSubroutine> local_c8;
  shared_ptr<slang::ast::SystemSubroutine> local_b8;
  shared_ptr<slang::ast::SystemSubroutine> local_a8;
  shared_ptr<slang::ast::SystemSubroutine> local_98;
  shared_ptr<slang::ast::SystemSubroutine> local_88;
  shared_ptr<slang::ast::SystemSubroutine> local_78;
  shared_ptr<slang::ast::SystemSubroutine> local_68;
  shared_ptr<slang::ast::SystemSubroutine> local_58;
  shared_ptr<slang::ast::SystemSubroutine> local_48;
  
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x87);
  local_6e0 = CONCAT31(local_6e0._1_3_,2);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DisplayTask,std::allocator<slang::ast::builtins::DisplayTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::DisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6d8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_48);
  if (local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x88);
  local_6e0 = local_6e0 & ~Shuffle;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DisplayTask,std::allocator<slang::ast::builtins::DisplayTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::DisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6d8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_58);
  if (local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x89);
  local_6e0 = CONCAT31(local_6e0._1_3_,1);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DisplayTask,std::allocator<slang::ast::builtins::DisplayTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::DisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6d8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_68);
  if (local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8a);
  local_6e0 = CONCAT31(local_6e0._1_3_,3);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DisplayTask,std::allocator<slang::ast::builtins::DisplayTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::DisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6d8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_78);
  if (local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8b);
  local_6e0 = CONCAT31(local_6e0._1_3_,2);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DisplayTask,std::allocator<slang::ast::builtins::DisplayTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::DisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6d8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_88);
  if (local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8c);
  local_6e0 = local_6e0 & ~Shuffle;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DisplayTask,std::allocator<slang::ast::builtins::DisplayTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::DisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6d8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_98);
  if (local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8d);
  local_6e0 = CONCAT31(local_6e0._1_3_,1);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DisplayTask,std::allocator<slang::ast::builtins::DisplayTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::DisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6d8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_a8);
  if (local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8e);
  local_6e0 = CONCAT31(local_6e0._1_3_,3);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DisplayTask,std::allocator<slang::ast::builtins::DisplayTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::DisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6d8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_b8);
  if (local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8f);
  local_6e0 = CONCAT31(local_6e0._1_3_,2);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::MonitorTask,std::allocator<slang::ast::builtins::MonitorTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(MonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::MonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6d8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_c8);
  if (local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x90);
  local_6e0 = local_6e0 & ~Shuffle;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::MonitorTask,std::allocator<slang::ast::builtins::MonitorTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(MonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::MonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6d8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_d8);
  if (local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x91);
  local_6e0 = CONCAT31(local_6e0._1_3_,1);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::MonitorTask,std::allocator<slang::ast::builtins::MonitorTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(MonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::MonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6d8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_e8);
  if (local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x92);
  local_6e0 = CONCAT31(local_6e0._1_3_,3);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::MonitorTask,std::allocator<slang::ast::builtins::MonitorTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(MonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::MonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6d8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_f8);
  if (local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x93);
  local_6e0 = CONCAT31(local_6e0._1_3_,2);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::MonitorTask,std::allocator<slang::ast::builtins::MonitorTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(MonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::MonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_108);
  if (local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x94);
  local_6e0 = local_6e0 & ~Shuffle;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::MonitorTask,std::allocator<slang::ast::builtins::MonitorTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(MonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::MonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_118);
  if (local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x95);
  local_6e0 = CONCAT31(local_6e0._1_3_,1);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::MonitorTask,std::allocator<slang::ast::builtins::MonitorTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(MonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::MonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_128);
  if (local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x96);
  local_6e0 = CONCAT31(local_6e0._1_3_,3);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::MonitorTask,std::allocator<slang::ast::builtins::MonitorTask>,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(MonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::MonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(LiteralBase *)&local_6e0);
  local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_138);
  if (local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x97);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileDisplayTask,std::allocator<slang::ast::builtins::FileDisplayTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileDisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileDisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_148);
  if (local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x98);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileDisplayTask,std::allocator<slang::ast::builtins::FileDisplayTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileDisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileDisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_158);
  if (local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x99);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileDisplayTask,std::allocator<slang::ast::builtins::FileDisplayTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileDisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileDisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_168);
  if (local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x9a);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileDisplayTask,std::allocator<slang::ast::builtins::FileDisplayTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileDisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileDisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_178);
  if (local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x9b);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileDisplayTask,std::allocator<slang::ast::builtins::FileDisplayTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileDisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileDisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_188);
  if (local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x9c);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileDisplayTask,std::allocator<slang::ast::builtins::FileDisplayTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileDisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileDisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_198);
  if (local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x9d);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileDisplayTask,std::allocator<slang::ast::builtins::FileDisplayTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileDisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileDisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1a8);
  if (local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x9e);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileDisplayTask,std::allocator<slang::ast::builtins::FileDisplayTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileDisplayTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileDisplayTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1b8);
  if (local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x9f);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileMonitorTask,std::allocator<slang::ast::builtins::FileMonitorTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileMonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileMonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1c8);
  if (local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xa0);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileMonitorTask,std::allocator<slang::ast::builtins::FileMonitorTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileMonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileMonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1d8);
  if (local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xa1);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileMonitorTask,std::allocator<slang::ast::builtins::FileMonitorTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileMonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileMonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1e8);
  if (local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xa2);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileMonitorTask,std::allocator<slang::ast::builtins::FileMonitorTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileMonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileMonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1f8);
  if (local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xa3);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileMonitorTask,std::allocator<slang::ast::builtins::FileMonitorTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileMonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileMonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_208);
  if (local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xa4);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileMonitorTask,std::allocator<slang::ast::builtins::FileMonitorTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileMonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileMonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_218);
  if (local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xa5);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileMonitorTask,std::allocator<slang::ast::builtins::FileMonitorTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileMonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileMonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_228);
  if (local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_228.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xa6);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FileMonitorTask,std::allocator<slang::ast::builtins::FileMonitorTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FileMonitorTask **)&local_6d8,
             (allocator<slang::ast::builtins::FileMonitorTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_238);
  if (local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_238.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xa7);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::StringOutputTask,std::allocator<slang::ast::builtins::StringOutputTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(StringOutputTask **)&local_6d8,
             (allocator<slang::ast::builtins::StringOutputTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_248);
  if (local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xa8);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::StringOutputTask,std::allocator<slang::ast::builtins::StringOutputTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(StringOutputTask **)&local_6d8,
             (allocator<slang::ast::builtins::StringOutputTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_258);
  if (local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xa9);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::StringOutputTask,std::allocator<slang::ast::builtins::StringOutputTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(StringOutputTask **)&local_6d8,
             (allocator<slang::ast::builtins::StringOutputTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_268);
  if (local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xaa);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::StringOutputTask,std::allocator<slang::ast::builtins::StringOutputTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(StringOutputTask **)&local_6d8,
             (allocator<slang::ast::builtins::StringOutputTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_278);
  if (local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_278.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xab);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::StringFormatTask,std::allocator<slang::ast::builtins::StringFormatTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(StringFormatTask **)&local_6d8,
             (allocator<slang::ast::builtins::StringFormatTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_288.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_288.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_288);
  if (local_288.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_288.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xac);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::PrintTimeScaleTask,std::allocator<slang::ast::builtins::PrintTimeScaleTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(PrintTimeScaleTask **)&local_6d8,
             (allocator<slang::ast::builtins::PrintTimeScaleTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_298.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_298.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_298);
  if (local_298.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_298.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xad);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DumpVarsTask,std::allocator<slang::ast::builtins::DumpVarsTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DumpVarsTask **)&local_6d8,
             (allocator<slang::ast::builtins::DumpVarsTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_2a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2a8);
  if (local_2a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2a8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xae);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DumpPortsTask,std::allocator<slang::ast::builtins::DumpPortsTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DumpPortsTask **)&local_6d8,
             (allocator<slang::ast::builtins::DumpPortsTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_2b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2b8);
  if (local_2b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xaf);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ShowVarsTask,std::allocator<slang::ast::builtins::ShowVarsTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(ShowVarsTask **)&local_6d8,
             (allocator<slang::ast::builtins::ShowVarsTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_2c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2c8);
  if (local_2c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x77);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::CastTask,std::allocator<slang::ast::builtins::CastTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(CastTask **)&local_6d8,
             (allocator<slang::ast::builtins::CastTask> *)&local_688,(KnownSystemName *)&local_6a8);
  local_2d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2d8);
  if (local_2d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2d8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x78);
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,3);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SeverityTask,std::allocator<slang::ast::builtins::SeverityTask>,slang::parsing::KnownSystemName,slang::ast::ElabSystemTaskKind>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SeverityTask **)&local_6d8,
             (allocator<slang::ast::builtins::SeverityTask> *)&local_6e0,
             (KnownSystemName *)&local_6a8,(ElabSystemTaskKind *)&local_688);
  local_2e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2e8);
  if (local_2e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2e8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x79);
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,2);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SeverityTask,std::allocator<slang::ast::builtins::SeverityTask>,slang::parsing::KnownSystemName,slang::ast::ElabSystemTaskKind>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SeverityTask **)&local_6d8,
             (allocator<slang::ast::builtins::SeverityTask> *)&local_6e0,
             (KnownSystemName *)&local_6a8,(ElabSystemTaskKind *)&local_688);
  local_2f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2f8);
  if (local_2f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2f8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x7a);
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,1);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SeverityTask,std::allocator<slang::ast::builtins::SeverityTask>,slang::parsing::KnownSystemName,slang::ast::ElabSystemTaskKind>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SeverityTask **)&local_6d8,
             (allocator<slang::ast::builtins::SeverityTask> *)&local_6e0,
             (KnownSystemName *)&local_6a8,(ElabSystemTaskKind *)&local_688);
  local_308.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_308.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_308);
  if (local_308.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_308.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x7b);
  local_6e0 = CONCAT31(local_6e0._1_3_,1);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FinishControlTask,std::allocator<slang::ast::builtins::FinishControlTask>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FinishControlTask **)&local_6d8,
             (allocator<slang::ast::builtins::FinishControlTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(bool *)&local_6e0);
  local_318.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_318.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_318);
  if (local_318.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_318.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x7c);
  local_6e0 = local_6e0 & ~Shuffle;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FinishControlTask,std::allocator<slang::ast::builtins::FinishControlTask>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FinishControlTask **)&local_6d8,
             (allocator<slang::ast::builtins::FinishControlTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(bool *)&local_6e0);
  local_328.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_328.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_328);
  if (local_328.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_328.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xb0);
  local_6e0 = CONCAT31(local_6e0._1_3_,1);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ReadWriteMemTask,std::allocator<slang::ast::builtins::ReadWriteMemTask>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(ReadWriteMemTask **)&local_6d8,
             (allocator<slang::ast::builtins::ReadWriteMemTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(bool *)&local_6e0);
  local_338.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_338.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_338);
  if (local_338.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_338.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xb1);
  local_6e0 = CONCAT31(local_6e0._1_3_,1);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ReadWriteMemTask,std::allocator<slang::ast::builtins::ReadWriteMemTask>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(ReadWriteMemTask **)&local_6d8,
             (allocator<slang::ast::builtins::ReadWriteMemTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(bool *)&local_6e0);
  local_348.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_348.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_348);
  if (local_348.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_348.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xb2);
  local_6e0 = local_6e0 & ~Shuffle;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ReadWriteMemTask,std::allocator<slang::ast::builtins::ReadWriteMemTask>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(ReadWriteMemTask **)&local_6d8,
             (allocator<slang::ast::builtins::ReadWriteMemTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(bool *)&local_6e0);
  local_358.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_358.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_358);
  if (local_358.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_358.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xb3);
  local_6e0 = local_6e0 & ~Shuffle;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ReadWriteMemTask,std::allocator<slang::ast::builtins::ReadWriteMemTask>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(ReadWriteMemTask **)&local_6d8,
             (allocator<slang::ast::builtins::ReadWriteMemTask> *)&local_688,
             (KnownSystemName *)&local_6a8,(bool *)&local_6e0);
  local_368.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_368.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_368);
  if (local_368.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_368.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xb4);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SReadMemTask,std::allocator<slang::ast::builtins::SReadMemTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SReadMemTask **)&local_6d8,
             (allocator<slang::ast::builtins::SReadMemTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_378.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_378.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_378);
  if (local_378.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_378.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xb5);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SReadMemTask,std::allocator<slang::ast::builtins::SReadMemTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SReadMemTask **)&local_6d8,
             (allocator<slang::ast::builtins::SReadMemTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_388.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_388.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_388);
  if (local_388.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_388.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6e0 = System;
  local_6ac = 0;
  pSVar1 = &this->stringType;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_688;
  local_688 = (PredefinedIntegerType *)pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l,&local_6d9);
  __args_1 = &this->intType;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1,
             &local_6ac,&local_6d8);
  local_398.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_398.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_398);
  if (local_398.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_398.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SdfAnnotateTask,std::allocator<slang::ast::builtins::SdfAnnotateTask>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SdfAnnotateTask **)&local_6d8,
             (allocator<slang::ast::builtins::SdfAnnotateTask> *)&local_6a8);
  local_3a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_3a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_3a8);
  if (local_3a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::StaticAssertTask,std::allocator<slang::ast::builtins::StaticAssertTask>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(StaticAssertTask **)&local_6d8,
             (allocator<slang::ast::builtins::StaticAssertTask> *)&local_6a8);
  local_3b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_3b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_3b8);
  if (local_3b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3b8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::FatalTask,std::allocator<slang::ast::builtins::FatalTask>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(FatalTask **)&local_6d8,
             (allocator<slang::ast::builtins::FatalTask> *)&local_6a8);
  local_3c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_3c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_3c8);
  if (local_3c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3c8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xb7);
  local_6e0 = CONCAT31(local_6e0._1_3_,1);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ScopeTask,std::allocator<slang::ast::builtins::ScopeTask>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(ScopeTask **)&local_6d8,
             (allocator<slang::ast::builtins::ScopeTask> *)&local_688,(KnownSystemName *)&local_6a8,
             (bool *)&local_6e0);
  local_3d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_3d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_3d8);
  if (local_3d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3d8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xb8);
  local_6e0 = local_6e0 & ~Shuffle;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ScopeTask,std::allocator<slang::ast::builtins::ScopeTask>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(ScopeTask **)&local_6d8,
             (allocator<slang::ast::builtins::ScopeTask> *)&local_688,(KnownSystemName *)&local_6a8,
             (bool *)&local_6e0);
  local_3e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_3e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_3e8);
  if (local_3e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3e8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,0xb9);
  __args_1_00 = &this->voidType;
  local_6e0 = Unknown;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6ac,
             (KnownSystemName *)&local_688,__args_1_00,(int *)&local_6e0,&local_6d8);
  local_3f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_3f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_3f8);
  if (local_3f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = TimeFormat;
  local_6ac = 0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_6d8;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)__args_1;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)__args_1;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pSVar1;
  local_6c0 = __args_1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6a8,__l_00,&local_6d9);
  local_688 = (PredefinedIntegerType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            (&_Stack_680,(SimpleSystemTask **)&local_688,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6a8);
  local_408.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_688;
  local_408.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_680._M_pi;
  local_688 = (PredefinedIntegerType *)0x0;
  _Stack_680._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_408);
  if (local_408.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_408.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_680._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_680._M_pi);
  }
  if (local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6a8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6a8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6a8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,0xbb);
  local_6e0 = Unknown;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6ac,
             (KnownSystemName *)&local_688,__args_1_00,(int *)&local_6e0,&local_6d8);
  local_418.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_418.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_418);
  if (local_418.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_418.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,0xbc);
  local_6e0 = Unknown;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6ac,
             (KnownSystemName *)&local_688,__args_1_00,(int *)&local_6e0,&local_6d8);
  local_428.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_428.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_428);
  if (local_428.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_428.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = DumpFile;
  local_6ac = 0;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_688;
  local_688 = (PredefinedIntegerType *)pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l_01,&local_6d9);
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6d8);
  local_438.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_438.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_438);
  if (local_438.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_438.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,0xbe);
  local_6e0 = Unknown;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6ac,
             (KnownSystemName *)&local_688,__args_1_00,(int *)&local_6e0,&local_6d8);
  local_448.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_448.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_448);
  if (local_448.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_448.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,0xbf);
  local_6e0 = Unknown;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6ac,
             (KnownSystemName *)&local_688,__args_1_00,(int *)&local_6e0,&local_6d8);
  local_458.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_458.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_458);
  if (local_458.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_458.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,0xc0);
  local_6e0 = Unknown;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6ac,
             (KnownSystemName *)&local_688,__args_1_00,(int *)&local_6e0,&local_6d8);
  local_468.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_468.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_468);
  if (local_468.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_468.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = DumpLimit;
  local_6ac = 1;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_688;
  local_688 = __args_1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l_02,&local_6d9);
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6d8);
  local_478.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_478.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_478);
  if (local_478.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_478.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,0xc2);
  local_6e0 = Unknown;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6ac,
             (KnownSystemName *)&local_688,__args_1_00,(int *)&local_6e0,&local_6d8);
  local_488.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_488.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_488);
  if (local_488.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_488.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = DumpPortsOn;
  local_6ac = 0;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_688;
  local_688 = (PredefinedIntegerType *)pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l_03,&local_6d9);
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6d8);
  local_498.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_498.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_498);
  if (local_498.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_498.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = DumpPortsOff;
  local_6ac = 0;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&local_688;
  local_688 = (PredefinedIntegerType *)pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l_04,&local_6d9);
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6d8);
  local_4a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_4a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_4a8);
  if (local_4a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4a8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = DumpPortsAll;
  local_6ac = 0;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&local_688;
  local_688 = (PredefinedIntegerType *)pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l_05,&local_6d9);
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6d8);
  local_4b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_4b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_4b8);
  if (local_4b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4b8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = DumpPortsLimit;
  local_6ac = 1;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)&local_688;
  local_688 = __args_1;
  _Stack_680._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l_06,&local_6d9);
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6d8);
  local_4c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_4c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_4c8);
  if (local_4c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4c8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = DumpPortsFlush;
  local_6ac = 0;
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)&local_688;
  local_688 = (PredefinedIntegerType *)pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l_07,&local_6d9);
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6d8);
  local_4d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_4d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_4d8);
  if (local_4d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4d8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = Input;
  local_6ac = 1;
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)&local_688;
  local_688 = (PredefinedIntegerType *)pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l_08,&local_6d9);
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6d8);
  local_4e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_4e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_4e8);
  if (local_4e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4e8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = Key;
  local_6ac = 0;
  __l_09._M_len = 1;
  __l_09._M_array = (iterator)&local_688;
  local_688 = (PredefinedIntegerType *)pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l_09,&local_6d9);
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6d8);
  local_4f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_4f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_4f8);
  if (local_4f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4f8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,0xca);
  local_6e0 = Unknown;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6ac,
             (KnownSystemName *)&local_688,__args_1_00,(int *)&local_6e0,&local_6d8);
  local_508.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_508.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_508);
  if (local_508.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_508.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = Log;
  local_6ac = 0;
  __l_10._M_len = 1;
  __l_10._M_array = (iterator)&local_688;
  local_688 = (PredefinedIntegerType *)pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l_10,&local_6d9);
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6d8);
  local_518.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_518.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_518);
  if (local_518.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_518.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,0xcc);
  local_6e0 = Unknown;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6ac,
             (KnownSystemName *)&local_688,__args_1_00,(int *)&local_6e0,&local_6d8);
  local_528.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_528.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_528);
  if (local_528.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_528.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = Reset;
  local_6ac = 0;
  __l_11._M_len = 3;
  __l_11._M_array = (iterator)&local_6a8;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)__args_1;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)__args_1;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__args_1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l_11,&local_6d9);
  local_688 = (PredefinedIntegerType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            (&_Stack_680,(SimpleSystemTask **)&local_688,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6d8);
  local_538.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_688;
  local_538.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_680._M_pi;
  local_688 = (PredefinedIntegerType *)0x0;
  _Stack_680._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_538);
  if (local_538.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_538.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_680._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_680._M_pi);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = Save;
  local_6ac = 1;
  __l_12._M_len = 1;
  __l_12._M_array = (iterator)&local_688;
  local_688 = (PredefinedIntegerType *)pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l_12,&local_6d9);
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6d8);
  local_548.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_548.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_548);
  if (local_548.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_548.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = Restart;
  local_6ac = 1;
  __l_13._M_len = 1;
  __l_13._M_array = (iterator)&local_688;
  local_688 = (PredefinedIntegerType *)pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l_13,&local_6d9);
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6d8);
  local_558.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_558.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_558);
  if (local_558.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_558.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = IncSave;
  local_6ac = 1;
  __l_14._M_len = 1;
  __l_14._M_array = (iterator)&local_688;
  local_688 = (PredefinedIntegerType *)pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l_14,&local_6d9);
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6d8);
  local_568.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_568.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_568);
  if (local_568.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_568.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6e0 = ShowScopes;
  local_6ac = 0;
  __l_15._M_len = 1;
  __l_15._M_array = (iterator)&local_688;
  local_688 = __args_1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_6d8,__l_15,&local_6d9);
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SimpleSystemTask,std::allocator<slang::ast::builtins::SimpleSystemTask>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(SimpleSystemTask **)&local_6a8,
             (allocator<slang::ast::builtins::SimpleSystemTask> *)&local_6e1,&local_6e0,__args_1_00,
             &local_6ac,&local_6d8);
  local_578.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6a8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_578.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_578);
  if (local_578.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_578.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6a8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6a8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x7d);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssertControlTask,std::allocator<slang::ast::builtins::AssertControlTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssertControlTask **)&local_6d8,
             (allocator<slang::ast::builtins::AssertControlTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_588.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_588.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_588);
  if (local_588.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_588.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x7e);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssertControlTask,std::allocator<slang::ast::builtins::AssertControlTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssertControlTask **)&local_6d8,
             (allocator<slang::ast::builtins::AssertControlTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_598.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_598.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_598);
  if (local_598.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_598.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x7f);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssertControlTask,std::allocator<slang::ast::builtins::AssertControlTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssertControlTask **)&local_6d8,
             (allocator<slang::ast::builtins::AssertControlTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_5a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_5a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_5a8);
  if (local_5a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5a8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x80);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssertControlTask,std::allocator<slang::ast::builtins::AssertControlTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssertControlTask **)&local_6d8,
             (allocator<slang::ast::builtins::AssertControlTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_5b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_5b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_5b8);
  if (local_5b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5b8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x81);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssertControlTask,std::allocator<slang::ast::builtins::AssertControlTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssertControlTask **)&local_6d8,
             (allocator<slang::ast::builtins::AssertControlTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_5c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_5c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_5c8);
  if (local_5c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5c8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x82);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssertControlTask,std::allocator<slang::ast::builtins::AssertControlTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssertControlTask **)&local_6d8,
             (allocator<slang::ast::builtins::AssertControlTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_5d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_5d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_5d8);
  if (local_5d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x83);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssertControlTask,std::allocator<slang::ast::builtins::AssertControlTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssertControlTask **)&local_6d8,
             (allocator<slang::ast::builtins::AssertControlTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_5e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_5e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_5e8);
  if (local_5e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5e8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x84);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssertControlTask,std::allocator<slang::ast::builtins::AssertControlTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssertControlTask **)&local_6d8,
             (allocator<slang::ast::builtins::AssertControlTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_5f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_5f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_5f8);
  if (local_5f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5f8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x85);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssertControlTask,std::allocator<slang::ast::builtins::AssertControlTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssertControlTask **)&local_6d8,
             (allocator<slang::ast::builtins::AssertControlTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_608.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_608.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_608);
  if (local_608.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_608.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x86);
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssertControlTask,std::allocator<slang::ast::builtins::AssertControlTask>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssertControlTask **)&local_6d8,
             (allocator<slang::ast::builtins::AssertControlTask> *)&local_688,
             (KnownSystemName *)&local_6a8);
  local_618.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_618.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_618);
  if (local_618.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_618.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xd2);
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,1);
  local_6e0 = IsUnbounded;
  local_6ac = 1;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::StochasticTask,std::allocator<slang::ast::builtins::StochasticTask>,slang::parsing::KnownSystemName,slang::ast::SubroutineKind,int,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(StochasticTask **)&local_6d8,
             (allocator<slang::ast::builtins::StochasticTask> *)&local_6e1,
             (KnownSystemName *)&local_6a8,(SubroutineKind *)&local_688,(int *)&local_6e0,&local_6ac
            );
  local_628.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_628.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_628);
  if (local_628.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_628.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xd3);
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,1);
  local_6e0 = IsUnbounded;
  local_6ac = 1;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::StochasticTask,std::allocator<slang::ast::builtins::StochasticTask>,slang::parsing::KnownSystemName,slang::ast::SubroutineKind,int,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(StochasticTask **)&local_6d8,
             (allocator<slang::ast::builtins::StochasticTask> *)&local_6e1,
             (KnownSystemName *)&local_6a8,(SubroutineKind *)&local_688,(int *)&local_6e0,&local_6ac
            );
  local_638.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_638.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_638);
  if (local_638.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_638.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xd4);
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,1);
  local_6e0 = Typename;
  local_6ac = 2;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::StochasticTask,std::allocator<slang::ast::builtins::StochasticTask>,slang::parsing::KnownSystemName,slang::ast::SubroutineKind,int,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(StochasticTask **)&local_6d8,
             (allocator<slang::ast::builtins::StochasticTask> *)&local_6e1,
             (KnownSystemName *)&local_6a8,(SubroutineKind *)&local_688,(int *)&local_6e0,&local_6ac
            );
  local_648.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_648.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_648);
  if (local_648.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_648.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xd5);
  local_688 = (PredefinedIntegerType *)CONCAT44(local_688._4_4_,1);
  local_6e0 = Typename;
  local_6ac = 2;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::StochasticTask,std::allocator<slang::ast::builtins::StochasticTask>,slang::parsing::KnownSystemName,slang::ast::SubroutineKind,int,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(StochasticTask **)&local_6d8,
             (allocator<slang::ast::builtins::StochasticTask> *)&local_6e1,
             (KnownSystemName *)&local_6a8,(SubroutineKind *)&local_688,(int *)&local_6e0,&local_6ac
            );
  local_658.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_658.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_658);
  if (local_658.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_658.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_6a8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xd6);
  local_688 = (PredefinedIntegerType *)((ulong)local_688 & 0xffffffff00000000);
  local_6e0 = Bits;
  local_6ac = 1;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::StochasticTask,std::allocator<slang::ast::builtins::StochasticTask>,slang::parsing::KnownSystemName,slang::ast::SubroutineKind,int,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6d8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(StochasticTask **)&local_6d8,
             (allocator<slang::ast::builtins::StochasticTask> *)&local_6e1,
             (KnownSystemName *)&local_6a8,(SubroutineKind *)&local_688,(int *)&local_6e0,&local_6ac
            );
  local_668.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6d8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_668.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6d8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_668);
  if (local_668.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_668.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_6d8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_6d8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  iVar2 = 0xd7;
  do {
    local_6a8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_6a8.
                           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar2);
    local_6d8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::PlaTask,std::allocator<slang::ast::builtins::PlaTask>,slang::parsing::KnownSystemName>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_6d8.
                super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,(PlaTask **)&local_6d8,
               (allocator<slang::ast::builtins::PlaTask> *)&local_688,(KnownSystemName *)&local_6a8)
    ;
    local_678.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_6d8.
         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_678.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_6d8.
         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_6d8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_6d8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    addSystemSubroutine(this,&local_678);
    if (local_678.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_678.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_6d8.
        super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_6d8.
                 super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0xe7);
  return;
}

Assistant:

void Builtins::registerSystemTasks() {
    using parsing::KnownSystemName;

#define REGISTER(type, name, base) addSystemSubroutine(std::make_shared<type>(name, base))
    REGISTER(DisplayTask, KnownSystemName::Display, LiteralBase::Decimal);
    REGISTER(DisplayTask, KnownSystemName::DisplayB, LiteralBase::Binary);
    REGISTER(DisplayTask, KnownSystemName::DisplayO, LiteralBase::Octal);
    REGISTER(DisplayTask, KnownSystemName::DisplayH, LiteralBase::Hex);
    REGISTER(DisplayTask, KnownSystemName::Write, LiteralBase::Decimal);
    REGISTER(DisplayTask, KnownSystemName::WriteB, LiteralBase::Binary);
    REGISTER(DisplayTask, KnownSystemName::WriteO, LiteralBase::Octal);
    REGISTER(DisplayTask, KnownSystemName::WriteH, LiteralBase::Hex);
    REGISTER(MonitorTask, KnownSystemName::Strobe, LiteralBase::Decimal);
    REGISTER(MonitorTask, KnownSystemName::StrobeB, LiteralBase::Binary);
    REGISTER(MonitorTask, KnownSystemName::StrobeO, LiteralBase::Octal);
    REGISTER(MonitorTask, KnownSystemName::StrobeH, LiteralBase::Hex);
    REGISTER(MonitorTask, KnownSystemName::Monitor, LiteralBase::Decimal);
    REGISTER(MonitorTask, KnownSystemName::MonitorB, LiteralBase::Binary);
    REGISTER(MonitorTask, KnownSystemName::MonitorO, LiteralBase::Octal);
    REGISTER(MonitorTask, KnownSystemName::MonitorH, LiteralBase::Hex);

#undef REGISTER
#define REGISTER(type, name) addSystemSubroutine(std::make_shared<type>(name))
    REGISTER(FileDisplayTask, KnownSystemName::FDisplay);
    REGISTER(FileDisplayTask, KnownSystemName::FDisplayB);
    REGISTER(FileDisplayTask, KnownSystemName::FDisplayO);
    REGISTER(FileDisplayTask, KnownSystemName::FDisplayH);
    REGISTER(FileDisplayTask, KnownSystemName::FWrite);
    REGISTER(FileDisplayTask, KnownSystemName::FWriteB);
    REGISTER(FileDisplayTask, KnownSystemName::FWriteO);
    REGISTER(FileDisplayTask, KnownSystemName::FWriteH);
    REGISTER(FileMonitorTask, KnownSystemName::FStrobe);
    REGISTER(FileMonitorTask, KnownSystemName::FStrobeB);
    REGISTER(FileMonitorTask, KnownSystemName::FStrobeO);
    REGISTER(FileMonitorTask, KnownSystemName::FStrobeH);
    REGISTER(FileMonitorTask, KnownSystemName::FMonitor);
    REGISTER(FileMonitorTask, KnownSystemName::FMonitorB);
    REGISTER(FileMonitorTask, KnownSystemName::FMonitorO);
    REGISTER(FileMonitorTask, KnownSystemName::FMonitorH);

    REGISTER(StringOutputTask, KnownSystemName::SWrite);
    REGISTER(StringOutputTask, KnownSystemName::SWriteB);
    REGISTER(StringOutputTask, KnownSystemName::SWriteO);
    REGISTER(StringOutputTask, KnownSystemName::SWriteH);

    REGISTER(StringFormatTask, KnownSystemName::SFormat);

    REGISTER(PrintTimeScaleTask, KnownSystemName::PrintTimeScale);

    REGISTER(DumpVarsTask, KnownSystemName::DumpVars);
    REGISTER(DumpPortsTask, KnownSystemName::DumpPorts);
    REGISTER(ShowVarsTask, KnownSystemName::ShowVars);

    REGISTER(CastTask, KnownSystemName::Cast);

#undef REGISTER
#define REGISTER(type, name, kind) addSystemSubroutine(std::make_shared<type>(name, kind))
    REGISTER(SeverityTask, KnownSystemName::Info, ElabSystemTaskKind::Info);
    REGISTER(SeverityTask, KnownSystemName::Warning, ElabSystemTaskKind::Warning);
    REGISTER(SeverityTask, KnownSystemName::Error, ElabSystemTaskKind::Error);

#undef REGISTER
#define REGISTER(type, name, isFinish) addSystemSubroutine(std::make_shared<type>(name, isFinish))
    REGISTER(FinishControlTask, KnownSystemName::Finish, true);
    REGISTER(FinishControlTask, KnownSystemName::Stop, false);

#undef REGISTER

    addSystemSubroutine(std::make_shared<ReadWriteMemTask>(KnownSystemName::ReadMemB, true));
    addSystemSubroutine(std::make_shared<ReadWriteMemTask>(KnownSystemName::ReadMemH, true));
    addSystemSubroutine(std::make_shared<ReadWriteMemTask>(KnownSystemName::WriteMemB, false));
    addSystemSubroutine(std::make_shared<ReadWriteMemTask>(KnownSystemName::WriteMemH, false));
    addSystemSubroutine(std::make_shared<SReadMemTask>(KnownSystemName::SReadMemB));
    addSystemSubroutine(std::make_shared<SReadMemTask>(KnownSystemName::SReadMemH));
    addSystemSubroutine(std::make_shared<SimpleSystemTask>(KnownSystemName::System, intType, 0,
                                                           std::vector<const Type*>{&stringType}));
    addSystemSubroutine(std::make_shared<SdfAnnotateTask>());
    addSystemSubroutine(std::make_shared<StaticAssertTask>());
    addSystemSubroutine(std::make_shared<FatalTask>());
    addSystemSubroutine(std::make_shared<ScopeTask>(KnownSystemName::List, true));
    addSystemSubroutine(std::make_shared<ScopeTask>(KnownSystemName::Scope, false));

#define TASK(name, required, ...)                                                    \
    addSystemSubroutine(std::make_shared<SimpleSystemTask>(name, voidType, required, \
                                                           std::vector<const Type*>{__VA_ARGS__}))

    TASK(KnownSystemName::Exit, 0, );

    TASK(KnownSystemName::TimeFormat, 0, &intType, &intType, &stringType, &intType);

    TASK(KnownSystemName::MonitorOn, 0, );
    TASK(KnownSystemName::MonitorOff, 0, );

    TASK(KnownSystemName::DumpFile, 0, &stringType);
    TASK(KnownSystemName::DumpOn, 0, );
    TASK(KnownSystemName::DumpOff, 0, );
    TASK(KnownSystemName::DumpAll, 0, );
    TASK(KnownSystemName::DumpLimit, 1, &intType);
    TASK(KnownSystemName::DumpFlush, 0, );
    TASK(KnownSystemName::DumpPortsOn, 0, &stringType);
    TASK(KnownSystemName::DumpPortsOff, 0, &stringType);
    TASK(KnownSystemName::DumpPortsAll, 0, &stringType);
    TASK(KnownSystemName::DumpPortsLimit, 1, &intType, &stringType);
    TASK(KnownSystemName::DumpPortsFlush, 0, &stringType);

    TASK(KnownSystemName::Input, 1, &stringType);
    TASK(KnownSystemName::Key, 0, &stringType);
    TASK(KnownSystemName::NoKey, 0, );
    TASK(KnownSystemName::Log, 0, &stringType);
    TASK(KnownSystemName::NoLog, 0, );
    TASK(KnownSystemName::Reset, 0, &intType, &intType, &intType);
    TASK(KnownSystemName::Save, 1, &stringType);
    TASK(KnownSystemName::Restart, 1, &stringType);
    TASK(KnownSystemName::IncSave, 1, &stringType);
    TASK(KnownSystemName::ShowScopes, 0, &intType);

#undef TASK

#define ASSERTCTRL(name) addSystemSubroutine(std::make_shared<AssertControlTask>(name))
    ASSERTCTRL(KnownSystemName::AssertControl);
    ASSERTCTRL(KnownSystemName::AssertOn);
    ASSERTCTRL(KnownSystemName::AssertOff);
    ASSERTCTRL(KnownSystemName::AssertKill);
    ASSERTCTRL(KnownSystemName::AssertPassOn);
    ASSERTCTRL(KnownSystemName::AssertPassOff);
    ASSERTCTRL(KnownSystemName::AssertFailOn);
    ASSERTCTRL(KnownSystemName::AssertFailOff);
    ASSERTCTRL(KnownSystemName::AssertNonvacuousOn);
    ASSERTCTRL(KnownSystemName::AssertVacuousOff);

#undef ASSERTCTRL

#define TASK(name, kind, input, output) \
    addSystemSubroutine(std::make_shared<StochasticTask>(name, kind, input, output))
    TASK(KnownSystemName::QInitialize, SubroutineKind::Task, 3, 1);
    TASK(KnownSystemName::QAdd, SubroutineKind::Task, 3, 1);
    TASK(KnownSystemName::QRemove, SubroutineKind::Task, 2, 2);
    TASK(KnownSystemName::QExam, SubroutineKind::Task, 2, 2);
    TASK(KnownSystemName::QFull, SubroutineKind::Function, 1, 1);

#undef TASK

    // There are 16 PLA tasks, with sequential enum values starting with $async$and$array
    for (int i = 0; i < 16; i++) {
        addSystemSubroutine(
            std::make_shared<PlaTask>((KnownSystemName)((int)KnownSystemName::AsyncAndArray + i)));
    }
}